

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

int __thiscall
SocketInternals::Send
          (SocketInternals *this,uchar *bufsend,size_t msglen,EthDestType destType,uchar ip_offset)

{
  in_addr_t iVar1;
  ssize_t sVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  sockaddr *__addr;
  
  if (destType == DEST_MULTICAST) {
    iVar6 = this->SocketFD;
    __addr = (sockaddr *)&this->ServerAddrMulticast;
  }
  else {
    if (destType != DEST_BROADCAST) {
      iVar1 = (this->ServerAddr).sin_addr.s_addr;
      if (ip_offset != '\0') {
        (this->ServerAddr).sin_addr.s_addr = (uint)ip_offset * 0x1000000 + iVar1;
      }
      sVar2 = sendto(this->SocketFD,bufsend,msglen,0,(sockaddr *)&this->ServerAddr,0x10);
      iVar6 = (int)sVar2;
      (this->ServerAddr).sin_addr.s_addr = iVar1;
      goto LAB_001167be;
    }
    iVar6 = this->SocketFD;
    __addr = (sockaddr *)&this->ServerAddrBroadcast;
  }
  sVar2 = sendto(iVar6,bufsend,msglen,0,__addr,0x10);
  iVar6 = (int)sVar2;
LAB_001167be:
  if (iVar6 == -1) {
    poVar4 = std::operator<<(this->outStr,"Send: failed to send: ");
    piVar3 = __errno_location();
    pcVar5 = strerror(*piVar3);
  }
  else {
    if (iVar6 == (int)msglen) {
      return iVar6;
    }
    poVar4 = this->outStr;
    pcVar5 = "Send: failed to send the whole message";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  return iVar6;
}

Assistant:

int SocketInternals::Send(const unsigned char *bufsend, size_t msglen, EthDestType destType, unsigned char ip_offset)
{
    int retval;
    if (destType == DEST_BROADCAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrBroadcast), sizeof(ServerAddrBroadcast));
    }
    else if (destType == DEST_MULTICAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrMulticast), sizeof(ServerAddrMulticast));
    }
    else {
        // Save base address (e.g., 169.254.0.100)
        uint32_t s_addr_saved = ServerAddr.sin_addr.s_addr;
        // Update IP address if needed (Firmware Rev 9+)
        if (ip_offset > 0)
            ServerAddr.sin_addr.s_addr += (ip_offset<<24);
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddr), sizeof(ServerAddr));
        // Restore base address
        ServerAddr.sin_addr.s_addr = s_addr_saved;
    }

    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Send: failed to send: " << WSAGetLastError() << std::endl;
#else
        outStr << "Send: failed to send: " << strerror(errno) << std::endl;
#endif
        return -1;
    }
    else if (retval != static_cast<int>(msglen)) {
        outStr << "Send: failed to send the whole message" << std::endl;
    }
    return retval;
}